

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3DriverBase::setViewPort(COpenGL3DriverBase *this,rect<int> *area)

{
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *this_00;
  vector2d<int> vVar1;
  vector2d<int> vVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  rect<int> vp;
  rect<int> rendert;
  rect<int> local_38;
  rect<int> local_28;
  
  local_38.UpperLeftCorner.X = (area->UpperLeftCorner).X;
  local_38.UpperLeftCorner.Y = (area->UpperLeftCorner).Y;
  local_38.LowerRightCorner.X = (area->LowerRightCorner).X;
  local_38.LowerRightCorner.Y = (area->LowerRightCorner).Y;
  iVar3 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])();
  iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])(this);
  local_28.LowerRightCorner.Y = *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
  local_28.UpperLeftCorner.X = 0;
  local_28.UpperLeftCorner.Y = 0;
  local_28.LowerRightCorner.X = iVar3;
  core::rect<int>::clipAgainst(&local_38,&local_28);
  iVar3 = local_38.UpperLeftCorner.X;
  if ((local_38.UpperLeftCorner.Y < local_38.LowerRightCorner.Y) &&
     (local_38.UpperLeftCorner.X < local_38.LowerRightCorner.X)) {
    this_00 = this->CacheHandler;
    iVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])(this);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::setViewport(this_00,iVar3,
                  *(int *)(CONCAT44(extraout_var_01,iVar4) + 4) - local_38.LowerRightCorner.Y,
                  local_38.LowerRightCorner.X - local_38.UpperLeftCorner.X,
                  local_38.LowerRightCorner.Y - local_38.UpperLeftCorner.Y);
  }
  vVar1.Y = local_38.UpperLeftCorner.Y;
  vVar1.X = local_38.UpperLeftCorner.X;
  vVar2.Y = local_38.LowerRightCorner.Y;
  vVar2.X = local_38.LowerRightCorner.X;
  (this->super_CNullDriver).ViewPort.UpperLeftCorner = vVar1;
  (this->super_CNullDriver).ViewPort.LowerRightCorner = vVar2;
  return;
}

Assistant:

void COpenGL3DriverBase::setViewPort(const core::rect<s32> &area)
{
	core::rect<s32> vp = area;
	core::rect<s32> rendert(0, 0, getCurrentRenderTargetSize().Width, getCurrentRenderTargetSize().Height);
	vp.clipAgainst(rendert);

	if (vp.getHeight() > 0 && vp.getWidth() > 0)
		CacheHandler->setViewport(vp.UpperLeftCorner.X, getCurrentRenderTargetSize().Height - vp.UpperLeftCorner.Y - vp.getHeight(), vp.getWidth(), vp.getHeight());

	ViewPort = vp;
}